

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O2

vector<FileStatus,_std::allocator<FileStatus>_> * workStatus(void)

{
  vector<FileStatus,_std::allocator<FileStatus>_> *in_RDI;
  string new_dir;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,".",&local_71);
  std::__cxx11::string::string((string *)&local_50,local_30);
  std::__cxx11::string::string((string *)&local_70,(string *)&STAGE_DIR_abi_cxx11_);
  diffStatus(in_RDI,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

Vector<FileStatus> workStatus(){
    String new_dir = ".";
    Vector<FileStatus> result = diffStatus(new_dir,STAGE_DIR);
    return result;
}